

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O0

void __thiscall covenant::DFA<covenant::Sym>::nondet_union(DFA<covenant::Sym> *this,dfa_t *other)

{
  int iVar1;
  bool bVar2;
  const_reference cVar3;
  int iVar4;
  uint uVar5;
  State SVar6;
  State SVar7;
  ulong uVar8;
  size_type sVar9;
  const_reference pvVar10;
  mapped_type_conflict *pmVar11;
  const_reference val;
  DFA<covenant::Sym> *this_00;
  const_reference pvVar12;
  const_reference pvVar13;
  string *msg;
  socklen_t *__addr_len;
  sockaddr *__addr;
  long in_RSI;
  DFA<covenant::Sym> *in_RDI;
  pair<boost::unordered::iterator_detail::iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_unsigned_int>_>_>,_bool>
  pVar14;
  DFA<covenant::Sym> *in_stack_00000008;
  bool is_not_empty;
  State old_start_other;
  State old_start_ndfa;
  State new_start;
  int i_1;
  uint ei;
  uint ti;
  uint ss;
  int i;
  uint nstates;
  MapStates mapping;
  DFA<covenant::Sym> *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  allocator *this_01;
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffee0;
  State in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  allocator local_e9;
  string local_e8 [35];
  undefined1 local_c5;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  State local_a4;
  int local_a0;
  uint local_9c;
  int local_98;
  value_type local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  node_pointer local_70;
  undefined1 local_68;
  pair<int,_unsigned_int> local_50;
  int local_48;
  int local_44;
  DFA<covenant::Sym> *in_stack_ffffffffffffffc0;
  
  bVar2 = std::vector<bool,_std::allocator<bool>_>::empty(in_stack_fffffffffffffeb0);
  if ((!bVar2) &&
     ((bVar2 = std::
               vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ::empty(in_stack_fffffffffffffe80), !bVar2 ||
      (bVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::empty((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)in_stack_fffffffffffffe80), !bVar2)))) {
    boost::unordered::
    unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    local_44 = nStates((DFA<covenant::Sym> *)0x23c570);
    for (local_48 = 0; iVar1 = local_48, iVar4 = nStates((DFA<covenant::Sym> *)0x23c59d),
        iVar1 < iVar4; local_48 = local_48 + 1) {
      local_50 = std::make_pair<int&,unsigned_int&>
                           ((int *)in_stack_fffffffffffffe68,(uint *)0x23c5c3);
      pVar14 = boost::unordered::
               unordered_map<unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
               ::insert<std::pair<int,unsigned_int>>
                         ((unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          (pair<int,_unsigned_int> *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                          in_stack_fffffffffffffe80);
      local_70 = (node_pointer)pVar14.first.node_;
      local_68 = pVar14.second;
      in_stack_fffffffffffffeec = CONCAT13(local_68,(int3)in_stack_fffffffffffffeec);
      local_44 = local_44 + 1;
      in_stack_fffffffffffffee8 =
           state((DFA<covenant::Sym> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8.id),
                 (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      local_74 = in_stack_fffffffffffffee8.id;
    }
    local_78 = 0;
    while( true ) {
      uVar8 = (ulong)local_78;
      sVar9 = std::
              vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
              ::size((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                      *)(in_RSI + 0x18));
      if (sVar9 <= uVar8) break;
      local_7c = 0;
      while( true ) {
        uVar8 = (ulong)local_7c;
        pvVar10 = std::
                  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                  ::operator[]((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                *)(in_RSI + 0x18),(ulong)local_78);
        sVar9 = std::
                vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                ::size(pvVar10);
        if (sVar9 <= uVar8) break;
        pmVar11 = boost::unordered::
                  unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_80 = (uint)mkState(*pmVar11);
        pvVar10 = std::
                  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                  ::operator[]((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                *)(in_RSI + 0x18),(ulong)local_78);
        val = std::
              vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
              ::operator[](pvVar10,(ulong)local_7c);
        pvVar10 = std::
                  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                  ::operator[]((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                *)(in_RSI + 0x18),(ulong)local_78);
        std::
        vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
        ::operator[](pvVar10,(ulong)local_7c);
        this_00 = (DFA<covenant::Sym> *)
                  boost::unordered::
                  unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_84 = (uint)mkState(*(mapped_type_conflict *)&(this_00->_tfac).px);
        transition(this_00,(State)(uint)((ulong)pmVar11 >> 0x20),&val->val,(State)(uint)pmVar11);
        local_7c = local_7c + 1;
      }
      local_88 = 0;
      while( true ) {
        uVar8 = (ulong)local_88;
        pvVar12 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)(in_RSI + 0x30),(ulong)local_78);
        sVar9 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
        if (sVar9 <= uVar8) break;
        pmVar11 = boost::unordered::
                  unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_8c = (uint)mkState(*pmVar11);
        pvVar12 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)(in_RSI + 0x30),(ulong)local_78);
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,(ulong)local_88);
        local_94 = *pvVar13;
        pmVar11 = boost::unordered::
                  unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_90 = (uint)mkState(*pmVar11);
        eps_transition(in_stack_fffffffffffffe68,
                       (State)(uint)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       (State)(uint)in_stack_fffffffffffffe70);
        local_88 = local_88 + 1;
      }
      local_78 = local_78 + 1;
    }
    local_98 = 0;
    while( true ) {
      iVar1 = local_98;
      uVar5 = nStates((DFA<covenant::Sym> *)0x23c94b);
      iVar4 = (int)(uVar8 >> 0x20);
      __addr_len = (socklen_t *)(ulong)uVar5;
      if ((int)uVar5 <= iVar1) break;
      cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      if (cVar3) {
        local_a0 = local_98;
        pmVar11 = boost::unordered::
                  unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_9c = (uint)mkState(*pmVar11);
        accept(in_RDI,local_9c,__addr,__addr_len);
      }
      local_98 = local_98 + 1;
    }
    nStates((DFA<covenant::Sym> *)0x23c9fc);
    SVar6 = state((DFA<covenant::Sym> *)
                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8.id),iVar4);
    local_a4 = SVar6;
    SVar7 = startState(in_stack_fffffffffffffe68);
    local_a8 = SVar7.id;
    local_b0 = (uint)startState(in_stack_fffffffffffffe68);
    pmVar11 = boost::unordered::
              unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::operator[]((unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)CONCAT44(SVar6.id,SVar7.id),
                           (key_type *)CONCAT44(local_b0,in_stack_fffffffffffffe88));
    local_ac = (uint)mkState(*pmVar11);
    local_b4 = local_a4.id;
    local_b8 = local_a8;
    eps_transition(in_stack_fffffffffffffe68,(State)(uint)((ulong)in_stack_fffffffffffffe70 >> 0x20)
                   ,(State)(uint)in_stack_fffffffffffffe70);
    local_bc = local_a4.id;
    local_c0 = local_ac;
    eps_transition(in_stack_fffffffffffffe68,(State)(uint)((ulong)in_stack_fffffffffffffe70 >> 0x20)
                   ,(State)(uint)in_stack_fffffffffffffe70);
    local_c4 = local_a4.id;
    setStart(in_RDI,local_a4);
    eps_elim(in_stack_ffffffffffffffc0);
    local_c5 = eliminateDeadStates(in_stack_00000008);
    if (!(bool)local_c5) {
      msg = (string *)__cxa_allocate_exception(0x20);
      this_01 = &local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e8,"nondet union of DFA\'s returned an empty automata",this_01);
      error::error((error *)this_01,msg);
      __cxa_throw(msg,&error::typeinfo,error::~error);
    }
    boost::unordered::
    unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      *)0x23cc3a);
  }
  return;
}

Assistant:

void nondet_union(const dfa_t &other)
    { 
      
      if (other.accepts.empty()) 
        return;
      if (other.trans.empty() && other.eps.empty()) 
        return;
      
      MapStates mapping; // mapping to relabel states old -> new
      
      unsigned int nstates = (unsigned int) this->nStates();
      for(int i=0; i< other.nStates(); i++)
      {
        mapping.insert(make_pair(i, nstates));
        this->state(nstates++);
      }
      
      for( unsigned int ss = 0; ss < other.trans.size(); ss++ )
      {
        for( unsigned int ti = 0; ti < other.trans[ss].size(); ti++ )
        {
          this->transition(mkState(mapping[ss]), 
                           other.trans[ss][ti].val,
                           mkState(mapping[other.trans[ss][ti].dest]));
        }
        for(unsigned int ei = 0; ei < other.eps[ss].size(); ei++)
        {
          this->eps_transition(mkState(mapping[ss]), 
                               mkState(mapping[other.eps[ss][ei]])); 
        }
      }
      
      // set new accepting states
      for (int i=0; i < other.nStates() ; i++)
      {
        if (other.accepts[i])
          this->accept(mkState(mapping[i]));
      }
      
      // finally, set new initial state
      State new_start       = this->state(this->nStates());
      State old_start_ndfa  = this->startState();
      State old_start_other = mkState(mapping[other.startState().id]);
      this->eps_transition(new_start, old_start_ndfa);
      this->eps_transition(new_start, old_start_other);
      this->setStart(new_start);
      // Make sure no epsilon transitions after union
      this->eps_elim();    
      bool is_not_empty = this->eliminateDeadStates();
      if (!is_not_empty)
        throw error("nondet union of DFA's returned an empty automata");
    }